

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_ls.c
# Opt level: O0

int arkLSSetUserData(ARKodeMem ark_mem,void *user_data)

{
  ARKodeMem in_RSI;
  int retval;
  ARKLsMem arkls_mem;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  char *in_stack_ffffffffffffffe0;
  int local_4;
  
  local_4 = arkLs_AccessLMem(in_RSI,in_stack_ffffffffffffffe0,
                             (ARKLsMem *)
                             CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  if (local_4 == 0) {
    if (*(int *)(in_stack_ffffffffffffffe0 + 8) == 0) {
      *(ARKodeMem *)(in_stack_ffffffffffffffe0 + 0x18) = in_RSI;
    }
    if (*(int *)(in_stack_ffffffffffffffe0 + 0xf0) == 0) {
      *(ARKodeMem *)(in_stack_ffffffffffffffe0 + 0x110) = in_RSI;
    }
    if (*(int *)(in_stack_ffffffffffffffe0 + 0x118) != 0) {
      *(ARKodeMem *)(in_stack_ffffffffffffffe0 + 0x128) = in_RSI;
    }
    *(ARKodeMem *)(in_stack_ffffffffffffffe0 + 0xe8) = in_RSI;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int arkLSSetUserData(ARKodeMem ark_mem, void* user_data)
{
  ARKLsMem arkls_mem;
  int retval;

  /* access ARKLsMem structure */
  retval = arkLs_AccessLMem(ark_mem, __func__, &arkls_mem);
  if (retval != ARKLS_SUCCESS) { return (retval); }

  /* Set data for Jacobian */
  if (!arkls_mem->jacDQ) { arkls_mem->J_data = user_data; }

  /* Set data for Jtimes */
  if (!arkls_mem->jtimesDQ) { arkls_mem->Jt_data = user_data; }

  /* Set data for LinSys */
  if (arkls_mem->user_linsys) { arkls_mem->A_data = user_data; }

  /* Set data for Preconditioner */
  arkls_mem->P_data = user_data;

  return (ARKLS_SUCCESS);
}